

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O1

bool __thiscall Opcode::AABBQuantizedNoLeafTree::Build(AABBQuantizedNoLeafTree *this,AABBTree *tree)

{
  AABBNoLeafNode *linear;
  undefined8 *puVar1;
  AABBNoLeafNode *pAVar2;
  sword *psVar3;
  udword uVar4;
  AABBQuantizedNoLeafNode *pAVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  udword j;
  uword *puVar11;
  uword uVar12;
  ulong uVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  Point Min;
  Point Max;
  udword CurID;
  float local_4c [6];
  udword local_34;
  
  if (tree == (AABBTree *)0x0) {
    return false;
  }
  uVar4 = (tree->super_AABBTreeNode).mNbPrimitives;
  bVar14 = tree->mTotalNbNodes == uVar4 * 2 - 1;
  if (bVar14) {
    (this->super_AABBOptimizedTree).mNbNodes = uVar4 - 1;
    pAVar5 = this->mNodes;
    if (pAVar5 != (AABBQuantizedNoLeafNode *)0x0) {
      operator_delete__(&pAVar5[-1].mNegData,pAVar5[-1].mNegData << 5 | 8);
      this->mNodes = (AABBQuantizedNoLeafNode *)0x0;
    }
    uVar13 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
    puVar6 = (ulong *)operator_new__(uVar13 * 0x28 + 8);
    linear = (AABBNoLeafNode *)(puVar6 + 1);
    *puVar6 = uVar13;
    if (uVar13 != 0) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)puVar6 + lVar9 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar9 = lVar9 + 0x28;
      } while (uVar13 * 0x28 != lVar9);
    }
    local_34 = 1;
    _BuildNoLeafTree(linear,0,&local_34,&tree->super_AABBTreeNode);
    uVar13 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
    puVar7 = (ulong *)operator_new__(uVar13 * 0x20 + 8);
    pAVar5 = (AABBQuantizedNoLeafNode *)(puVar7 + 1);
    *puVar7 = uVar13;
    if (uVar13 != 0) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)puVar7 + lVar9 + 0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar9 = lVar9 + 0x20;
      } while (uVar13 * 0x20 != lVar9);
    }
    this->mNodes = pAVar5;
    if (uVar13 == 0) {
      fVar15 = -3.4028235e+38;
      fVar19 = -3.4028235e+38;
      fVar20 = -3.4028235e+38;
      fVar16 = -3.4028235e+38;
      fVar17 = -3.4028235e+38;
      fVar18 = -3.4028235e+38;
    }
    else {
      lVar9 = 0;
      fVar22 = -3.4028235e+38;
      fVar23 = -3.4028235e+38;
      fVar21 = -3.4028235e+38;
      fVar24 = -3.4028235e+38;
      fVar25 = -3.4028235e+38;
      fVar26 = -3.4028235e+38;
      do {
        fVar16 = ABS(*(float *)((long)puVar6 + lVar9 + 8));
        if (fVar16 <= fVar26) {
          fVar16 = fVar26;
        }
        fVar17 = ABS(*(float *)((long)puVar6 + lVar9 + 0xc));
        if (fVar17 <= fVar24) {
          fVar17 = fVar24;
        }
        fVar18 = ABS(*(float *)((long)puVar6 + lVar9 + 0x10));
        if (fVar18 <= fVar23) {
          fVar18 = fVar23;
        }
        fVar15 = ABS(*(float *)((long)puVar6 + lVar9 + 0x14));
        if (fVar15 <= fVar25) {
          fVar15 = fVar25;
        }
        fVar19 = ABS(*(float *)((long)puVar6 + lVar9 + 0x18));
        if (fVar19 <= fVar21) {
          fVar19 = fVar21;
        }
        fVar20 = ABS(*(float *)((long)puVar6 + lVar9 + 0x1c));
        if (fVar20 <= fVar22) {
          fVar20 = fVar22;
        }
        lVar9 = lVar9 + 0x28;
        fVar22 = fVar20;
        fVar23 = fVar18;
        fVar21 = fVar19;
        fVar24 = fVar17;
        fVar25 = fVar15;
        fVar26 = fVar16;
      } while (uVar13 * 0x28 != lVar9);
    }
    fVar16 = (float)(-(uint)(fVar16 != 0.0) & (uint)(32767.0 / fVar16));
    fVar17 = (float)(-(uint)(fVar17 != 0.0) & (uint)(32767.0 / fVar17));
    fVar18 = (float)(-(uint)(fVar18 != 0.0) & (uint)(32767.0 / fVar18));
    fVar15 = (float)(-(uint)(fVar15 != 0.0) & (uint)(32767.0 / fVar15));
    fVar19 = (float)(-(uint)(fVar19 != 0.0) & (uint)(32767.0 / fVar19));
    fVar20 = (float)(-(uint)(fVar20 != 0.0) & (uint)(32767.0 / fVar20));
    (this->mCenterCoeff).x = (float)(-(uint)(fVar16 != 0.0) & (uint)(1.0 / fVar16));
    (this->mCenterCoeff).y = (float)(-(uint)(fVar17 != 0.0) & (uint)(1.0 / fVar17));
    (this->mCenterCoeff).z = (float)(-(uint)(fVar18 != 0.0) & (uint)(1.0 / fVar18));
    (this->mExtentsCoeff).x = (float)(-(uint)(fVar15 != 0.0) & (uint)(1.0 / fVar15));
    (this->mExtentsCoeff).y = (float)(-(uint)(fVar19 != 0.0) & (uint)(1.0 / fVar19));
    (this->mExtentsCoeff).z = (float)(-(uint)(fVar20 != 0.0) & (uint)(1.0 / fVar20));
    if (uVar13 != 0) {
      uVar8 = 0;
      do {
        pAVar2 = linear + uVar8;
        fVar22 = (pAVar2->mAABB).mCenter.x;
        lVar9 = uVar8 * 0x20;
        pAVar5[uVar8].mAABB.mCenter[0] = (sword)(int)(fVar16 * fVar22);
        fVar23 = (pAVar2->mAABB).mCenter.y;
        *(short *)((long)puVar7 + lVar9 + 10) = (short)(int)(fVar17 * fVar23);
        fVar21 = (pAVar2->mAABB).mCenter.z;
        *(short *)((long)puVar7 + lVar9 + 0xc) = (short)(int)(fVar18 * fVar21);
        fVar24 = (pAVar2->mAABB).mExtents.x;
        *(short *)((long)puVar7 + lVar9 + 0xe) = (short)(int)(fVar15 * fVar24);
        *(short *)(puVar7 + uVar8 * 4 + 2) = (short)(int)((pAVar2->mAABB).mExtents.y * fVar19);
        *(short *)((long)puVar7 + lVar9 + 0x12) = (short)(int)((pAVar2->mAABB).mExtents.z * fVar20);
        fVar25 = (pAVar2->mAABB).mExtents.y;
        fVar26 = (pAVar2->mAABB).mExtents.z;
        local_4c[3] = fVar22 + fVar24;
        local_4c[4] = fVar23 + fVar25;
        local_4c[5] = fVar21 + fVar26;
        local_4c[0] = fVar22 - fVar24;
        local_4c[1] = fVar23 - fVar25;
        local_4c[2] = fVar21 - fVar26;
        lVar9 = 0;
        do {
          psVar3 = pAVar5[uVar8].mAABB.mCenter + lVar9;
          puVar11 = (uword *)(psVar3 + 3);
          fVar21 = (float)(int)*psVar3 * (&(this->mCenterCoeff).x)[lVar9];
          fVar22 = (&(this->mExtentsCoeff).x)[lVar9];
          fVar23 = local_4c[lVar9 + 3];
          uVar12 = *puVar11;
          bVar14 = true;
          do {
            fVar24 = (float)uVar12 * fVar22;
            if ((fVar21 + fVar24 < fVar23) ||
               (fVar24 = fVar21 - fVar24, local_4c[lVar9] <= fVar24 && fVar24 != local_4c[lVar9])) {
              uVar12 = uVar12 + 1;
              *puVar11 = uVar12;
            }
            else {
              bVar14 = false;
            }
            if (uVar12 == 0) {
              *puVar11 = 0xffff;
              uVar12 = 0xffff;
              bVar14 = false;
            }
          } while (bVar14);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
        uVar10 = pAVar2->mPosData;
        if ((uVar10 & 1) == 0) {
          uVar10 = (long)(pAVar5->mAABB).mCenter +
                   (ulong)((uint)((ulong)(uint)((int)uVar10 - (int)linear) * 0xcccccccd >> 0x20) &
                          0xffffffe0);
        }
        puVar7[uVar8 * 4 + 3] = uVar10;
        uVar10 = pAVar2->mNegData;
        if ((uVar10 & 1) == 0) {
          uVar10 = (long)(pAVar5->mAABB).mCenter +
                   (ulong)((uint)((ulong)(uint)((int)uVar10 - (int)linear) * 0xcccccccd >> 0x20) &
                          0xffffffe0);
        }
        puVar7[uVar8 * 4 + 4] = uVar10;
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar13);
    }
    operator_delete__(puVar6,*puVar6 * 0x28 + 8);
    bVar14 = true;
  }
  return bVar14;
}

Assistant:

bool AABBQuantizedNoLeafTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	mNbNodes = NbTriangles-1;
	DELETEARRAY(mNodes);
	AABBNoLeafNode* Nodes = new AABBNoLeafNode[mNbNodes];
	CHECKALLOC(Nodes);

	// Build the tree
	udword CurID = 1;
	_BuildNoLeafTree(Nodes, 0, CurID, tree);
	ASSERT(CurID==mNbNodes);

	// Quantize
	{
		mNodes = new AABBQuantizedNoLeafNode[mNbNodes];
		CHECKALLOC(mNodes);

		// Get max values
		FIND_MAX_VALUES

		// Quantization
		INIT_QUANTIZATION

		// Quantize
		uintptr_t Data;
		for(udword i=0;i<mNbNodes;i++)
		{
			PERFORM_QUANTIZATION
			REMAP_DATA(mPosData)
			REMAP_DATA(mNegData)
		}

		DELETEARRAY(Nodes);
	}

	return true;
}